

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

void __thiscall FPalette::SetPalette(FPalette *this,BYTE *colors)

{
  int i;
  long lVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 uVar4;
  BYTE BVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  lVar1 = 0;
  do {
    this->BaseColors[lVar1].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)colors[1] << 8 | (uint)*colors << 0x10 | (uint)colors[2]);
    this->Remap[lVar1] = (BYTE)lVar1;
    lVar1 = lVar1 + 1;
    colors = colors + 3;
  } while (lVar1 != 0x100);
  uVar3 = 0x30603;
  uVar2 = 0;
  uVar6 = 0;
  do {
    uVar8 = this->BaseColors[uVar2].field_0.field_0.r ^ 0xff;
    uVar9 = this->BaseColors[uVar2].field_0.field_0.g ^ 0xff;
    uVar7 = this->BaseColors[uVar2].field_0.field_0.b ^ 0xff;
    uVar7 = uVar7 * uVar7 + uVar9 * uVar9 + uVar8 * uVar8;
    if (uVar7 < uVar3) {
      if (uVar7 == 0) {
        BVar5 = (BYTE)uVar2;
        break;
      }
      uVar6 = uVar2 & 0xffffffff;
      uVar3 = uVar7;
    }
    BVar5 = (BYTE)uVar6;
    uVar2 = uVar2 + 1;
  } while ((int)uVar2 != 0xff);
  this->WhiteIndex = BVar5;
  uVar3 = 0x30603;
  lVar1 = 0;
  uVar4 = 0;
  do {
    uVar8 = (uint)this->BaseColors[lVar1].field_0.field_0.r;
    uVar9 = (uint)this->BaseColors[lVar1].field_0.field_0.g;
    uVar7 = (uint)this->BaseColors[lVar1].field_0.field_0.b;
    uVar7 = uVar7 * uVar7 + uVar9 * uVar9 + uVar8 * uVar8;
    if (uVar7 < uVar3) {
      uVar4 = (undefined4)lVar1;
      BVar5 = (BYTE)lVar1;
      uVar3 = uVar7;
      if (uVar7 == 0) break;
    }
    BVar5 = (BYTE)uVar4;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 0xff);
  this->BlackIndex = BVar5;
  return;
}

Assistant:

void FPalette::SetPalette (const BYTE *colors)
{
	for (int i = 0; i < 256; i++, colors += 3)
	{
		BaseColors[i] = PalEntry (colors[0], colors[1], colors[2]);
		Remap[i] = i;
	}

	// Find white and black from the original palette so that they can be
	// used to make an educated guess of the translucency % for a BOOM
	// translucency map.
	WhiteIndex = BestColor ((DWORD *)BaseColors, 255, 255, 255, 0, 255);
	BlackIndex = BestColor ((DWORD *)BaseColors, 0, 0, 0, 0, 255);
}